

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS
ref_interp_integrate
          (REF_GRID ref_grid,REF_DBL *candidate,REF_DBL *truth,REF_INT norm_power,REF_DBL *error)

{
  REF_MPI ref_mpi_00;
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double local_148;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT part;
  REF_DBL truth_at_gauss_point;
  REF_DBL candidate_at_gauss_point;
  REF_DBL bary [4];
  double local_f0;
  REF_DBL total_volume;
  REF_DBL volume;
  REF_DBL diff;
  REF_INT nodes [27];
  int local_5c;
  REF_INT node;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT i;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_DBL *error_local;
  REF_INT norm_power_local;
  REF_DBL *truth_local;
  REF_DBL *candidate_local;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[8];
  *error = 0.0;
  local_f0 = 0.0;
  node = 0;
  do {
    if (ref_cell_00->max <= node) {
      ref_grid_local._4_4_ = ref_mpi_allsum(ref_mpi_00,error,1,3);
      if (ref_grid_local._4_4_ == 0) {
        dVar3 = pow(*error,1.0 / (double)norm_power);
        *error = dVar3;
        ref_grid_local._4_4_ = ref_mpi_allsum(ref_mpi_00,&local_f0,1,3);
        if (ref_grid_local._4_4_ == 0) {
          *error = *error / local_f0;
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xa34,"ref_interp_integrate",(ulong)ref_grid_local._4_4_,"all sum");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xa32,"ref_interp_integrate",(ulong)ref_grid_local._4_4_,"all sum");
      }
      return ref_grid_local._4_4_;
    }
    RVar1 = ref_cell_nodes(ref_cell_00,node,(REF_INT *)&diff);
    if (RVar1 == 0) {
      uVar2 = ref_cell_part(ref_cell_00,ref_node_00,node,&ref_private_macro_code_rss_1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xa1e,"ref_interp_integrate",(ulong)uVar2,"owner");
        return uVar2;
      }
      if (ref_private_macro_code_rss_1 == ref_mpi_00->id) {
        uVar2 = ref_node_tet_vol(ref_node_00,(REF_INT *)&diff,&total_volume);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xa20,"ref_interp_integrate",(ulong)uVar2,"vol");
          return uVar2;
        }
        local_f0 = total_volume + local_f0;
        for (cell_node = 0; cell_node < nq; cell_node = cell_node + 1) {
          bary[0] = (xq[cell_node] + 1.0) * 0.5;
          bary[1] = (yq[cell_node] + 1.0) * 0.5;
          bary[2] = (zq[cell_node] + 1.0) * 0.5;
          candidate_at_gauss_point = ((1.0 - bary[0]) - bary[1]) - bary[2];
          truth_at_gauss_point = 0.0;
          _ref_private_macro_code_rss = 0.0;
          for (local_5c = 0; local_5c < ref_cell_00->node_per; local_5c = local_5c + 1) {
            truth_at_gauss_point =
                 bary[(long)local_5c + -1] * candidate[nodes[(long)local_5c + -2]] +
                 truth_at_gauss_point;
            _ref_private_macro_code_rss =
                 bary[(long)local_5c + -1] * truth[nodes[(long)local_5c + -2]] +
                 _ref_private_macro_code_rss;
          }
          if (truth_at_gauss_point - _ref_private_macro_code_rss <= 0.0) {
            local_148 = -(truth_at_gauss_point - _ref_private_macro_code_rss);
          }
          else {
            local_148 = truth_at_gauss_point - _ref_private_macro_code_rss;
          }
          volume = local_148;
          dVar3 = wq[cell_node] * 0.75 * total_volume;
          dVar4 = pow(local_148,(double)norm_power);
          *error = dVar3 * dVar4 + *error;
        }
      }
    }
    node = node + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_interp_integrate(REF_GRID ref_grid, REF_DBL *candidate,
                                        REF_DBL *truth, REF_INT norm_power,
                                        REF_DBL *error) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, cell, cell_node, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL diff, volume, total_volume, bary[4];
  REF_DBL candidate_at_gauss_point, truth_at_gauss_point;
  REF_INT part;
  *error = 0.0;
  total_volume = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "owner");
    if (part != ref_mpi_rank(ref_mpi)) continue;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    total_volume += volume;
    for (i = 0; i < nq; i++) {
      bary[1] = 0.5 * (1.0 + xq[i]);
      bary[2] = 0.5 * (1.0 + yq[i]);
      bary[3] = 0.5 * (1.0 + zq[i]);
      bary[0] = 1.0 - bary[1] - bary[2] - bary[3];
      candidate_at_gauss_point = 0.0;
      truth_at_gauss_point = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        node = nodes[cell_node];
        candidate_at_gauss_point += bary[cell_node] * candidate[node];
        truth_at_gauss_point += bary[cell_node] * truth[node];
      }
      diff = ABS(candidate_at_gauss_point - truth_at_gauss_point);
      *error += (6.0 / 8.0) * wq[i] * volume * pow(diff, norm_power);
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, error, 1, REF_DBL_TYPE), "all sum");
  *error = pow(*error, 1.0 / ((REF_DBL)norm_power));
  RSS(ref_mpi_allsum(ref_mpi, &total_volume, 1, REF_DBL_TYPE), "all sum");
  *error /= total_volume;
  return REF_SUCCESS;
}